

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

void __thiscall Fl_Table::draw(Fl_Table *this)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  Fl_Boxtype FVar5;
  int iVar6;
  int iVar7;
  Fl_Color FVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int local_f4;
  int local_3c;
  int local_38;
  int c_2;
  int r_2;
  int c_1;
  int r_1;
  int H;
  int W;
  int Y;
  int X;
  int r;
  int c;
  int scrollsize;
  Fl_Table *this_local;
  
  _c = this;
  iVar3 = Fl::scrollbar_size();
  r = iVar3;
  if (((this->vscrollbar != (Fl_Scrollbar *)0x0) &&
      (iVar4 = Fl_Widget::w((Fl_Widget *)this->vscrollbar), iVar3 != iVar4)) ||
     ((iVar3 = r, this->hscrollbar != (Fl_Scrollbar *)0x0 &&
      (iVar4 = Fl_Widget::h((Fl_Widget *)this->hscrollbar), iVar3 != iVar4)))) {
    table_resized(this);
  }
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])
            (this,1,0,0,(ulong)(uint)this->tix,(ulong)(uint)this->tiy,this->tiw,this->tih);
  fl_push_clip(this->wix,this->wiy,this->wiw,this->wih);
  Fl_Group::draw(&this->super_Fl_Group);
  fl_pop_clip();
  FVar5 = Fl_Widget::box((Fl_Widget *)this);
  iVar3 = Fl_Widget::x((Fl_Widget *)this);
  iVar4 = Fl_Widget::y((Fl_Widget *)this);
  iVar6 = Fl_Widget::w((Fl_Widget *)this);
  iVar7 = Fl_Widget::h((Fl_Widget *)this);
  FVar8 = Fl_Widget::color((Fl_Widget *)this);
  Fl_Widget::draw_box((Fl_Widget *)this,FVar5,iVar3,iVar4,iVar6,iVar7,FVar8);
  uVar9 = Fl_Widget::visible((Fl_Widget *)this->table);
  if ((uVar9 == 0) &&
     ((bVar2 = Fl_Widget::damage((Fl_Widget *)this), (bVar2 & 0x80) != 0 ||
      (bVar2 = Fl_Widget::damage((Fl_Widget *)this), (bVar2 & 1) != 0)))) {
    FVar5 = Fl_Widget::box((Fl_Widget *)this->table);
    iVar3 = this->tox;
    iVar4 = this->toy;
    iVar6 = this->tow;
    iVar7 = this->toh;
    FVar8 = Fl_Widget::color((Fl_Widget *)this->table);
    Fl_Widget::draw_box((Fl_Widget *)this,FVar5,iVar3,iVar4,iVar6,iVar7,FVar8);
  }
  fl_push_clip(this->wix,this->wiy,this->wiw,this->wih);
  bVar2 = Fl_Widget::damage((Fl_Widget *)this);
  if (((bVar2 & 0x80) == 0) && (this->_redraw_leftcol != -1)) {
    fl_push_clip(this->tix,this->tiy,this->tiw,this->tih);
    for (X = this->_redraw_leftcol; X <= this->_redraw_rightcol; X = X + 1) {
      for (Y = this->_redraw_toprow; Y <= this->_redraw_botrow; Y = Y + 1) {
        _redraw_cell(this,CONTEXT_CELL,Y,X);
      }
    }
    fl_pop_clip();
  }
  bVar2 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar2 & 0x80) != 0) {
    iVar3 = row_header(this);
    if (iVar3 != 0) {
      get_bounds(this,CONTEXT_ROW_HEADER,&W,&H,&r_1,&c_1);
      fl_push_clip(W,H,r_1,c_1);
      for (r_2 = this->toprow; r_2 <= this->botrow; r_2 = r_2 + 1) {
        _redraw_cell(this,CONTEXT_ROW_HEADER,r_2,0);
      }
      fl_pop_clip();
    }
    iVar3 = col_header(this);
    if (iVar3 != 0) {
      get_bounds(this,CONTEXT_COL_HEADER,&W,&H,&r_1,&c_1);
      fl_push_clip(W,H,r_1,c_1);
      for (c_2 = this->leftcol; c_2 <= this->rightcol; c_2 = c_2 + 1) {
        _redraw_cell(this,CONTEXT_COL_HEADER,0,c_2);
      }
      fl_pop_clip();
    }
    fl_push_clip(this->tix,this->tiy,this->tiw,this->tih);
    for (local_38 = this->toprow; local_38 <= this->botrow; local_38 = local_38 + 1) {
      for (local_3c = this->leftcol; local_3c <= this->rightcol; local_3c = local_3c + 1) {
        _redraw_cell(this,CONTEXT_CELL,local_38,local_3c);
      }
    }
    fl_pop_clip();
    iVar3 = row_header(this);
    if ((iVar3 != 0) && (iVar3 = col_header(this), iVar3 != 0)) {
      iVar3 = this->wix;
      iVar4 = this->wiy;
      iVar6 = row_header_width(this);
      iVar7 = col_header_height(this);
      FVar8 = Fl_Widget::color((Fl_Widget *)this);
      fl_rectf(iVar3,iVar4,iVar6,iVar7,FVar8);
    }
    FVar5 = Fl_Widget::box((Fl_Widget *)this->table);
    if (FVar5 != FL_NO_BOX) {
      iVar3 = col_header(this);
      if (iVar3 != 0) {
        iVar3 = this->tox;
        iVar4 = this->wiy;
        FVar5 = Fl_Widget::box((Fl_Widget *)this->table);
        iVar6 = Fl::box_dx(FVar5);
        iVar7 = col_header_height(this);
        FVar8 = Fl_Widget::color((Fl_Widget *)this);
        fl_rectf(iVar3,iVar4,iVar6,iVar7,FVar8);
      }
      iVar3 = row_header(this);
      if (iVar3 != 0) {
        iVar3 = this->wix;
        iVar4 = this->toy;
        iVar6 = row_header_width(this);
        FVar5 = Fl_Widget::box((Fl_Widget *)this->table);
        iVar7 = Fl::box_dx(FVar5);
        FVar8 = Fl_Widget::color((Fl_Widget *)this);
        fl_rectf(iVar3,iVar4,iVar6,iVar7,FVar8);
      }
    }
    if (this->table_w < this->tiw) {
      iVar3 = this->tix;
      iVar4 = this->table_w;
      iVar6 = this->tiy;
      iVar7 = this->tiw;
      iVar1 = this->table_w;
      iVar10 = this->tih;
      FVar8 = Fl_Widget::color((Fl_Widget *)this);
      fl_rectf(iVar3 + iVar4,iVar6,iVar7 - iVar1,iVar10,FVar8);
      iVar3 = col_header(this);
      if (iVar3 != 0) {
        iVar3 = this->tix;
        iVar4 = this->table_w;
        iVar6 = this->wiy;
        iVar7 = this->tiw;
        iVar1 = this->table_w;
        FVar5 = Fl_Widget::box((Fl_Widget *)this->table);
        iVar10 = Fl::box_dw(FVar5);
        FVar5 = Fl_Widget::box((Fl_Widget *)this->table);
        iVar11 = Fl::box_dx(FVar5);
        iVar12 = col_header_height(this);
        FVar8 = Fl_Widget::color((Fl_Widget *)this);
        fl_rectf(iVar3 + iVar4,iVar6,((iVar7 - iVar1) + iVar10) - iVar11,iVar12,FVar8);
      }
    }
    if (this->table_h < this->tih) {
      iVar3 = this->tix;
      iVar4 = this->tiy;
      iVar6 = this->table_h;
      iVar7 = this->tiw;
      iVar1 = this->tih;
      iVar10 = this->table_h;
      FVar8 = Fl_Widget::color((Fl_Widget *)this);
      fl_rectf(iVar3,iVar4 + iVar6,iVar7,iVar1 - iVar10,FVar8);
      iVar3 = row_header(this);
      if (iVar3 != 0) {
        iVar3 = this->wix;
        iVar4 = this->tiy;
        iVar6 = this->table_h;
        iVar12 = row_header_width(this);
        iVar7 = this->wiy;
        iVar1 = this->wih;
        iVar10 = this->tiy;
        iVar11 = this->table_h;
        uVar9 = Fl_Widget::visible((Fl_Widget *)this->hscrollbar);
        if (uVar9 == 0) {
          local_f4 = 0;
        }
        else {
          local_f4 = r;
        }
        FVar8 = Fl_Widget::color((Fl_Widget *)this);
        fl_rectf(iVar3,iVar4 + iVar6,iVar12,((iVar7 + iVar1) - (iVar10 + iVar11)) - local_f4,FVar8);
      }
    }
  }
  uVar9 = Fl_Widget::visible((Fl_Widget *)this->vscrollbar);
  if ((uVar9 != 0) && (uVar9 = Fl_Widget::visible((Fl_Widget *)this->hscrollbar), uVar9 != 0)) {
    iVar3 = Fl_Widget::x((Fl_Widget *)this->vscrollbar);
    iVar4 = Fl_Widget::y((Fl_Widget *)this->hscrollbar);
    iVar6 = Fl_Widget::w((Fl_Widget *)this->vscrollbar);
    iVar7 = Fl_Widget::h((Fl_Widget *)this->hscrollbar);
    FVar8 = Fl_Widget::color((Fl_Widget *)this);
    fl_rectf(iVar3,iVar4,iVar6,iVar7,FVar8);
  }
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])
            (this,2,0,0,(ulong)(uint)this->tix,(ulong)(uint)this->tiy,this->tiw,this->tih);
  this->_redraw_botrow = -1;
  this->_redraw_toprow = -1;
  this->_redraw_rightcol = -1;
  this->_redraw_leftcol = -1;
  fl_pop_clip();
  return;
}

Assistant:

void Fl_Table::draw() {   
#if FLTK_ABI_VERSION >= 10301
    // NEW
    int scrollsize = _scrollbar_size ? _scrollbar_size : Fl::scrollbar_size();
#else
    // OLD
    int scrollsize = Fl::scrollbar_size();
#endif
  // Check if scrollbar size changed
  if ( ( vscrollbar && (scrollsize != vscrollbar->w()) ) || 
       ( hscrollbar && (scrollsize != hscrollbar->h()) ) ) {
    // handle size change, min/max, table dim's, etc
    table_resized();
  }

  draw_cell(CONTEXT_STARTPAGE, 0, 0,	 	// let user's drawing routine
            tix, tiy, tiw, tih);		// prep new page
  
  // Let fltk widgets draw themselves first. Do this after
  // draw_cell(CONTEXT_STARTPAGE) in case user moves widgets around.
  // Use window 'inner' clip to prevent drawing into table border.
  // (unfortunately this clips FLTK's border, so we must draw it explicity below)
  //
  fl_push_clip(wix, wiy, wiw, wih);
  {
    Fl_Group::draw();
  }
  fl_pop_clip();
  
  // Explicitly draw border around widget, if any
  draw_box(box(), x(), y(), w(), h(), color());
  
  // If Fl_Scroll 'table' is hidden, draw its box
  //    Do this after Fl_Group::draw() so we draw over scrollbars
  //    that leak around the border.
  //
  if ( ! table->visible() ) {
    if ( damage() & FL_DAMAGE_ALL || damage() & FL_DAMAGE_CHILD ) {
      draw_box(table->box(), tox, toy, tow, toh, table->color());
    }
  } 
  // Clip all further drawing to the inner widget dimensions
  fl_push_clip(wix, wiy, wiw, wih);
  {
    // Only redraw a few cells?
    if ( ! ( damage() & FL_DAMAGE_ALL ) && _redraw_leftcol != -1 ) {
      fl_push_clip(tix, tiy, tiw, tih);
      for ( int c = _redraw_leftcol; c <= _redraw_rightcol; c++ ) {
        for ( int r = _redraw_toprow; r <= _redraw_botrow; r++ ) { 
          _redraw_cell(CONTEXT_CELL, r, c);
        }
      }
      fl_pop_clip();
    }
    if ( damage() & FL_DAMAGE_ALL ) {
      int X,Y,W,H;
      // Draw row headers, if any
      if ( row_header() ) {
        get_bounds(CONTEXT_ROW_HEADER, X, Y, W, H);
        fl_push_clip(X,Y,W,H);
        for ( int r = toprow; r <= botrow; r++ ) {
          _redraw_cell(CONTEXT_ROW_HEADER, r, 0);
        }
        fl_pop_clip();
      }
      // Draw column headers, if any
      if ( col_header() ) {
        get_bounds(CONTEXT_COL_HEADER, X, Y, W, H);
        fl_push_clip(X,Y,W,H);
        for ( int c = leftcol; c <= rightcol; c++ ) {
          _redraw_cell(CONTEXT_COL_HEADER, 0, c);
        }
        fl_pop_clip();
      } 
      // Draw all cells.
      //    This includes cells partially obscured off edges of table.
      //    No longer do this last; you might think it would be nice
      //    to draw over dead zones, but on redraws it flickers. Avoid
      //    drawing over deadzones; prevent deadzones by sizing columns.
      //
      fl_push_clip(tix, tiy, tiw, tih); {
        for ( int r = toprow; r <= botrow; r++ ) {
          for ( int c = leftcol; c <= rightcol; c++ ) {
            _redraw_cell(CONTEXT_CELL, r, c); 
          }
        }
      }
      fl_pop_clip(); 
      // Draw little rectangle in corner of headers
      if ( row_header() && col_header() ) {
        fl_rectf(wix, wiy, row_header_width(), col_header_height(), color());
      }
      
      // Table has a boxtype? Close those few dead pixels
      if ( table->box() ) {
        if ( col_header() ) {
          fl_rectf(tox, wiy, Fl::box_dx(table->box()), col_header_height(), color());
        }
        if ( row_header() ) {
          fl_rectf(wix, toy, row_header_width(), Fl::box_dx(table->box()), color());
        }
      }
      
      // Table width smaller than window? Fill remainder with rectangle
      if ( table_w < tiw ) {
        fl_rectf(tix + table_w, tiy, tiw - table_w, tih, color()); 
        // Col header? fill that too
        if ( col_header() ) {
          fl_rectf(tix + table_w, 
                   wiy, 
                   // get that corner just right..
                   (tiw - table_w + Fl::box_dw(table->box()) - 
                    Fl::box_dx(table->box())),
                   col_header_height(),
                   color());
        }
      } 
      // Table height smaller than window? Fill remainder with rectangle
      if ( table_h < tih ) {
        fl_rectf(tix, tiy + table_h, tiw, tih - table_h, color()); 
        if ( row_header() ) {
          // NOTE:
          //     Careful with that lower corner; don't use tih; when eg.
          //     table->box(FL_THIN_UP_FRAME) and hscrollbar hidden,
          //     leaves a row of dead pixels.
          //
          fl_rectf(wix, tiy + table_h, row_header_width(), 
                   (wiy+wih) - (tiy+table_h) - 
                   ( hscrollbar->visible() ? scrollsize : 0),
                   color());
        }
      }
    } 
    // Both scrollbars? Draw little box in lower right
    if ( vscrollbar->visible() && hscrollbar->visible() ) {
      fl_rectf(vscrollbar->x(), hscrollbar->y(), 
               vscrollbar->w(), hscrollbar->h(), color());
    } 
    draw_cell(CONTEXT_ENDPAGE, 0, 0,		// let user's drawing
              tix, tiy, tiw, tih);		// routines cleanup
    
    _redraw_leftcol = _redraw_rightcol = _redraw_toprow = _redraw_botrow = -1;
  }
  fl_pop_clip();
}